

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1UpsampledPredTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1UpsampledPredTest_DISABLED_Speed_Test>
           *this)

{
  AV1UpsampledPredTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1UpsampledPredTest *)operator_new(0x48);
  anon_unknown.dwarf_180f112::AV1UpsampledPredTest::AV1UpsampledPredTest(this_00);
  (this_00->super_AV1CompMaskPredBase).super_Test._vptr_Test =
       (_func_int **)&PTR__AV1UpsampledPredTest_00f495a8;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__AV1UpsampledPredTest_DISABLED_Speed_Test_00f495e8
  ;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }